

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

void switch_v7m_security_state(CPUARMState_conflict *env,_Bool new_secstate)

{
  uint32_t uVar1;
  uint32_t uVar2;
  _Bool _Var3;
  uint32_t new_ss_psp;
  uint32_t new_ss_msp;
  _Bool new_secstate_local;
  CPUARMState_conflict *env_local;
  
  if ((env->v7m).secure != (uint)new_secstate) {
    uVar1 = (env->v7m).other_ss_msp;
    uVar2 = (env->v7m).other_ss_psp;
    _Var3 = v7m_using_psp(env);
    if (_Var3) {
      (env->v7m).other_ss_psp = env->regs[0xd];
      (env->v7m).other_ss_msp = (env->v7m).other_sp;
    }
    else {
      (env->v7m).other_ss_msp = env->regs[0xd];
      (env->v7m).other_ss_psp = (env->v7m).other_sp;
    }
    (env->v7m).secure = (uint)new_secstate;
    _Var3 = v7m_using_psp(env);
    if (_Var3) {
      env->regs[0xd] = uVar2;
      (env->v7m).other_sp = uVar1;
    }
    else {
      env->regs[0xd] = uVar1;
      (env->v7m).other_sp = uVar2;
    }
  }
  return;
}

Assistant:

static void switch_v7m_security_state(CPUARMState *env, bool new_secstate)
{
    uint32_t new_ss_msp, new_ss_psp;

    if (env->v7m.secure == new_secstate) {
        return;
    }

    /*
     * All the banked state is accessed by looking at env->v7m.secure
     * except for the stack pointer; rearrange the SP appropriately.
     */
    new_ss_msp = env->v7m.other_ss_msp;
    new_ss_psp = env->v7m.other_ss_psp;

    if (v7m_using_psp(env)) {
        env->v7m.other_ss_psp = env->regs[13];
        env->v7m.other_ss_msp = env->v7m.other_sp;
    } else {
        env->v7m.other_ss_msp = env->regs[13];
        env->v7m.other_ss_psp = env->v7m.other_sp;
    }

    env->v7m.secure = new_secstate;

    if (v7m_using_psp(env)) {
        env->regs[13] = new_ss_psp;
        env->v7m.other_sp = new_ss_msp;
    } else {
        env->regs[13] = new_ss_msp;
        env->v7m.other_sp = new_ss_psp;
    }
}